

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_test.cc
# Opt level: O2

void __thiscall
Base64Test_DecodeBase64_Test::~Base64Test_DecodeBase64_Test(Base64Test_DecodeBase64_Test *this)

{
  ~Base64Test_DecodeBase64_Test
            ((Base64Test_DecodeBase64_Test *)
             &this[-1].super_Base64Test.super_TestWithParam<Base64TestVector>.super_Test.
              gtest_flag_saver_);
  return;
}

Assistant:

TEST_P(Base64Test, DecodeBase64) {
  const Base64TestVector &t = GetParam();
  if (t.relation == valid) {
    // The non-canonical encodings will generally have odd whitespace etc
    // that |EVP_DecodeBase64| will reject.
    return;
  }

  const std::string encoded(RemoveNewlines(t.encoded));
  std::vector<uint8_t> out_vec(encoded.size());
  uint8_t *out = out_vec.data();

  size_t len;
  int ok = EVP_DecodeBase64(out, &len, out_vec.size(),
                            (const uint8_t *)encoded.data(), encoded.size());

  if (t.relation == invalid) {
    EXPECT_FALSE(ok);
  } else if (t.relation == canonical) {
    ASSERT_TRUE(ok);
    EXPECT_EQ(Bytes(t.decoded), Bytes(out, len));
  }
}